

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_obmc_inter_prediction
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **above,int *above_stride,uint8_t **left,
               int *left_stride)

{
  obmc_inter_pred_ctxt ctxt_left;
  obmc_inter_pred_ctxt ctxt_above;
  int in_stack_00000024;
  BLOCK_SIZE bsize;
  
  foreach_overlappable_nb_above
            ((AV1_COMMON *)left,(MACROBLOCKD *)left_stride,in_stack_00000024,
             (overlappable_nb_visitor_t)ctxt_above.adjacent_stride,ctxt_above.adjacent);
  foreach_overlappable_nb_left
            ((AV1_COMMON *)left,(MACROBLOCKD *)left_stride,in_stack_00000024,
             (overlappable_nb_visitor_t)ctxt_above.adjacent_stride,ctxt_above.adjacent);
  return;
}

Assistant:

void av1_build_obmc_inter_prediction(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                     uint8_t *above[MAX_MB_PLANE],
                                     int above_stride[MAX_MB_PLANE],
                                     uint8_t *left[MAX_MB_PLANE],
                                     int left_stride[MAX_MB_PLANE]) {
  const BLOCK_SIZE bsize = xd->mi[0]->bsize;

  // handle above row
  struct obmc_inter_pred_ctxt ctxt_above = { above, above_stride };
  foreach_overlappable_nb_above(cm, xd,
                                max_neighbor_obmc[mi_size_wide_log2[bsize]],
                                build_obmc_inter_pred_above, &ctxt_above);

  // handle left column
  struct obmc_inter_pred_ctxt ctxt_left = { left, left_stride };
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_inter_pred_left, &ctxt_left);
}